

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

bool __thiscall
FNodeBuilder::CheckSubsector(FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg)

{
  FPrivSeg *pFVar1;
  uint seg_00;
  DWORD seg;
  sector_t_conflict *psVar2;
  bool bVar3;
  
  pFVar1 = (this->Segs).Array;
  psVar2 = (sector_t_conflict *)0x0;
  seg_00 = set;
  while (((pFVar1[seg_00].linedef == -1 || (pFVar1[seg_00].frontsector == psVar2)) ||
         (bVar3 = psVar2 == (sector_t_conflict *)0x0, psVar2 = pFVar1[seg_00].frontsector, bVar3)))
  {
    seg_00 = pFVar1[seg_00].next;
    if (seg_00 == 0xffffffff) {
LAB_003bbf95:
      if (this->GLNodes != true) {
        return false;
      }
      bVar3 = CheckSubsectorOverlappingSegs(this,set,node,splitseg);
      return bVar3;
    }
  }
  if (seg_00 != 0xffffffff) {
    *splitseg = 0xffffffff;
    bVar3 = ShoveSegBehind(this,set,node,seg_00,0xffffffff);
    return bVar3;
  }
  goto LAB_003bbf95;
}

Assistant:

bool FNodeBuilder::CheckSubsector (DWORD set, node_t &node, DWORD &splitseg)
{
	sector_t *sec;
	DWORD seg;

	sec = NULL;
	seg = set;

	do
	{
		D(Printf (PRINT_LOG, " - seg %d%c(%d,%d)-(%d,%d) line %d front %d back %d\n", seg,
			Segs[seg].linedef == -1 ? '+' : ' ',
			Vertices[Segs[seg].v1].x>>16, Vertices[Segs[seg].v1].y>>16,
			Vertices[Segs[seg].v2].x>>16, Vertices[Segs[seg].v2].y>>16,
			Segs[seg].linedef,
			Segs[seg].frontsector == NULL ? -1 : Segs[seg].frontsector - sectors,
			Segs[seg].backsector == NULL ? -1 : Segs[seg].backsector - sectors));
		if (Segs[seg].linedef != -1 &&
			Segs[seg].frontsector != sec
			// Segs with the same front and back sectors are allowed to reside
			// in a subsector with segs from a different sector, because the
			// only effect they can have on the display is to place masked
			// mid textures in the scene. Since minisegs only mark subsector
			// boundaries, their sector information is unimportant.
			//
			// Update: Lines with the same front and back sectors *can* affect
			// the display if their subsector does not match their front sector.
			/*&& Segs[seg].frontsector != Segs[seg].backsector*/)
		{
			if (sec == NULL)
			{
				sec = Segs[seg].frontsector;
			}
			else
			{
				break;
			}
		}
		seg = Segs[seg].next;
	} while (seg != DWORD_MAX);

	if (seg == DWORD_MAX)
	{ // It's a valid non-GL subsector, and probably a valid GL subsector too.
		if (GLNodes)
		{
			return CheckSubsectorOverlappingSegs (set, node, splitseg);
		}
		return false;
	}

	D(Printf(PRINT_LOG, "Need to synthesize a splitter for set %d on seg %d\n", set, seg));
	splitseg = DWORD_MAX;

	// This is a very simple and cheap "fix" for subsectors with segs
	// from multiple sectors, and it seems ZenNode does something
	// similar. It is the only technique I could find that makes the
	// "transparent water" in nb_bmtrk.wad work properly.
	return ShoveSegBehind (set, node, seg, DWORD_MAX);
}